

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

ExprBase ** __thiscall
SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>::
find(SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>
     *this,TypedFunctionInstanceRequest *key)

{
  uint uVar1;
  Node *pNVar2;
  TypeBase *pTVar3;
  SynBase *pSVar4;
  ExprBase **in_RAX;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  uVar1 = this->bucketCount;
  if (uVar1 == 0) {
    return (ExprBase **)0x0;
  }
  uVar5 = key->hash & uVar1 - 1;
  pNVar2 = this->data;
  uVar6 = 1;
  while( true ) {
    pTVar3 = pNVar2[uVar5].key.instanceType;
    pSVar4 = pNVar2[uVar5].key.syntax;
    if (pTVar3 == (TypeBase *)0x0 && pSVar4 == (SynBase *)0x0) {
      bVar7 = false;
      in_RAX = (ExprBase **)0x0;
    }
    else if ((pTVar3 == key->instanceType) && (pSVar4 == key->syntax)) {
      in_RAX = &pNVar2[uVar5].value;
      bVar7 = false;
    }
    else {
      uVar5 = uVar5 + uVar6 & uVar1 - 1;
      bVar7 = true;
    }
    if (!bVar7) break;
    bVar7 = uVar6 == uVar1;
    uVar6 = uVar6 + 1;
    if (bVar7) {
      return (ExprBase **)0x0;
    }
  }
  return in_RAX;
}

Assistant:

Value* find(const Key& key) const
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
				return NULL;

			if(item.key == key)
				return &item.value;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return NULL;
	}